

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io__writer.cc
# Opt level: O3

bool __thiscall xemmai::io::t_writer::f_write(t_writer *this,t_io *a_library)

{
  char *pcVar1;
  __pointer_type ptVar2;
  t_object *ptVar3;
  t_object *ptVar4;
  t_pvalue *a_stack;
  char *pcVar5;
  undefined8 extraout_RAX;
  t_object *p;
  char *pcVar7;
  t_type **pptVar8;
  long in_FS_OFFSET;
  t_pvalue local_30;
  intptr_t iVar6;
  
  ptVar2 = (this->v_buffer).v_p._M_b._M_p;
  pcVar1 = ptVar2->v_data + 8;
  pcVar7 = this->v_remain;
  if (this->v_remain == (char *)0x0) {
    this->v_remain = pcVar1;
    pcVar7 = pcVar1;
  }
  local_30.super_t_pointer.v_p = (this->v_stream).v_p._M_b._M_p;
  ptVar3 = (a_library->v_symbol_write).v_p._M_b._M_p;
  ptVar4 = (this->v_buffer).v_p._M_b._M_p;
  pcVar5 = this->v_p1;
  a_stack = *(t_pvalue **)(in_FS_OFFSET + -0x30);
  *(t_pvalue **)(in_FS_OFFSET + -0x30) = a_stack + 5;
  a_stack[4].super_t_pointer.v_p = (t_object *)0x3;
  a_stack[4].field_0.v_integer = (long)pcVar5 - (long)pcVar7;
  a_stack[3].super_t_pointer.v_p = (t_object *)0x3;
  a_stack[3].field_0.v_integer = (long)pcVar7 - (long)pcVar1;
  a_stack[2].super_t_pointer.v_p = ptVar4;
  a_stack[1].super_t_pointer.v_p = (t_object *)0x0;
  pptVar8 = (t_type **)
            (*(long *)(in_FS_OFFSET + -0x78) + 0x10 + (long)local_30.super_t_pointer.v_p * 8);
  if ((__pointer_type)0x4 < local_30.super_t_pointer.v_p) {
    pptVar8 = &(local_30.super_t_pointer.v_p)->v_type;
  }
  t_type_of<xemmai::t_object>::f_invoke(*pptVar8,&local_30,ptVar3,&f_write::index,a_stack,3);
  ptVar3 = (a_stack->super_t_pointer).v_p;
  iVar6 = (a_stack->field_0).v_integer;
  *(t_pvalue **)(in_FS_OFFSET + -0x30) = a_stack;
  if (ptVar3 != (t_object *)0x3) {
    if ((((ptVar3 < (t_object *)0x3) || (ptVar3 == (t_object *)0x4)) ||
        (ptVar3->v_type->v_depth == 0)) ||
       ((undefined8 *)ptVar3->v_type->v_ids[1] != &v__type_id<long>)) {
      f_write();
      *(t_pvalue **)(in_FS_OFFSET + -0x30) = a_stack;
      _Unwind_Resume(extraout_RAX);
    }
    if ((t_object *)0x4 < ptVar3) {
      iVar6 = *(intptr_t *)ptVar3->v_data;
    }
  }
  pcVar5 = this->v_remain + iVar6;
  this->v_remain = pcVar5;
  pcVar7 = this->v_p1;
  if (pcVar7 <= pcVar5) {
    this->v_p1 = pcVar1;
    this->v_n1 = *(size_t *)ptVar2->v_data;
    this->v_remain = (char *)0x0;
  }
  return pcVar7 <= pcVar5;
}

Assistant:

bool t_writer::f_write(t_io* a_library)
{
	auto& buffer = v_buffer->f_as<t_bytes>();
	auto p = reinterpret_cast<char*>(&buffer[0]);
	if (!v_remain) v_remain = p;
	static size_t index;
	auto n = t_pvalue(v_stream).f_invoke(a_library->f_symbol_write(), index, t_pvalue(v_buffer), v_remain - p, v_p1 - v_remain);
	f_check<size_t>(n, L"result of write");
	v_remain += f_as<size_t>(n);
	if (v_remain < v_p1) return false;
	v_p1 = p;
	v_n1 = buffer.f_size();
	v_remain = nullptr;
	return true;
}